

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Pooling_x86_avx2::forward(Pooling_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _func_int **pp_Var6;
  size_t _elemsize;
  int *piVar7;
  Mat *pMVar8;
  int iVar9;
  int iVar13;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar14;
  undefined1 (*pauVar15) [32];
  undefined1 (*pauVar16) [16];
  ulong uVar17;
  Option *opt_00;
  _func_int *p_Var18;
  long lVar20;
  int k;
  int iVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  Pooling *this_00;
  long lVar25;
  int iVar26;
  int iVar27;
  void *pvVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  float fVar34;
  __m128 _inv_maxk;
  undefined1 auVar35 [32];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_138;
  allocator_type local_121;
  Mat *local_120;
  ulong local_118;
  int local_10c;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  void *local_f0;
  Mat local_e8;
  _func_int **local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  long local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  Option *pOVar19;
  
  pp_Var6 = this->_vptr_Pooling_x86_avx2;
  this_00 = (Pooling *)((long)&this->_vptr_Pooling_x86_avx2 + (long)pp_Var6[-3]);
  if (*(int *)(&this->field_0x100 + (long)pp_Var6[-3]) != 0) {
LAB_001fb6ff:
    iVar9 = Pooling::forward(this_00,bottom_blob,top_blob,opt);
    return iVar9;
  }
  iVar9 = bottom_blob->w;
  iVar21 = bottom_blob->h;
  uVar10 = bottom_blob->c;
  uVar17 = (ulong)uVar10;
  _elemsize = bottom_blob->elemsize;
  local_120 = top_blob;
  if (bottom_blob->elempack == 4) {
    if (this_00->global_pooling != 0) {
      Mat::create(top_blob,uVar10,_elemsize,4,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar21 = iVar21 * iVar9;
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx2[-3]) == 0) {
        if ((int)uVar10 < 1) {
          return 0;
        }
        uVar11 = 0;
        do {
          lVar20 = bottom_blob->cstep * uVar11 * bottom_blob->elemsize;
          auVar38 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar20);
          if (0 < iVar21) {
            pauVar16 = (undefined1 (*) [16])((long)bottom_blob->data + lVar20);
            iVar9 = iVar21;
            do {
              auVar38 = vmaxps_avx(auVar38,*pauVar16);
              pauVar16 = pauVar16 + 1;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar11 * 0x10) = auVar38;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar17);
        return 0;
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx2[-3]) != 1) {
        return 0;
      }
      if ((int)uVar10 < 1) {
        return 0;
      }
      fVar34 = 1.0 / (float)iVar21;
      uVar11 = 0;
      do {
        if (iVar21 < 1) {
          fVar36 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
          fVar44 = 0.0;
        }
        else {
          pfVar14 = (float *)(bottom_blob->cstep * uVar11 * bottom_blob->elemsize +
                             (long)bottom_blob->data);
          fVar36 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
          fVar44 = 0.0;
          iVar9 = iVar21;
          do {
            fVar36 = fVar36 + *pfVar14;
            fVar42 = fVar42 + pfVar14[1];
            fVar43 = fVar43 + pfVar14[2];
            fVar44 = fVar44 + pfVar14[3];
            pfVar14 = pfVar14 + 4;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        pfVar14 = (float *)((long)top_blob->data + uVar11 * 0x10);
        *pfVar14 = fVar36 * fVar34;
        pfVar14[1] = fVar42 * fVar34;
        pfVar14[2] = fVar43 * fVar34;
        pfVar14[3] = fVar44 * fVar34;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar17);
      return 0;
    }
    local_e8.cstep = 0;
    local_e8.data = (void *)0x0;
    local_e8.refcount._0_4_ = 0;
    local_e8.refcount._4_4_ = 0;
    local_e8.elemsize._0_4_ = 0;
    local_e8.elemsize._4_4_ = 0;
    local_e8.elempack = 0;
    local_e8.allocator = (Allocator *)0x0;
    local_e8.dims = 0;
    local_e8.d = 0;
    local_e8.c = 0;
    local_e8.w = local_e8.refcount._4_4_;
    local_e8.h = (int)local_e8.elemsize;
    Pooling::make_padding
              ((Pooling *)((long)&this->_vptr_Pooling_x86_avx2 + (long)pp_Var6[-3]),bottom_blob,
               &local_e8,opt);
    iVar21 = local_e8.h;
    iVar9 = local_e8.w;
    pMVar8 = local_120;
    iVar13 = -100;
    if ((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
      p_Var18 = this->_vptr_Pooling_x86_avx2[-3];
      uVar11 = (long)(local_e8.w - *(int *)(&this->field_0xd4 + (long)p_Var18)) /
               (long)*(int *)(&this->field_0xdc + (long)p_Var18);
      local_f8 = uVar11 & 0xffffffff;
      uVar32 = (long)(local_e8.h - *(int *)(&this->field_0xd8 + (long)p_Var18)) /
               (long)*(int *)(&this->field_0xe0 + (long)p_Var18);
      local_118 = uVar32 & 0xffffffff;
      uVar31 = (int)uVar11 + 1;
      Mat::create(local_120,uVar31,(int)uVar32 + 1,uVar10,_elemsize,4,opt->blob_allocator);
      if ((pMVar8->data != (void *)0x0) && ((long)pMVar8->c * pMVar8->cstep != 0)) {
        uVar11 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86_avx2[-3]) *
                 (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86_avx2[-3]);
        std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar11,&local_121);
        pp_Var6 = this->_vptr_Pooling_x86_avx2;
        p_Var18 = pp_Var6[-3];
        iVar13 = *(int *)(&this->field_0xd8 + (long)p_Var18);
        if (0 < iVar13) {
          iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var18);
          iVar24 = 0;
          iVar26 = 0;
          iVar27 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var6[-3])) {
              lVar20 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar27 + lVar20] = iVar26 + (int)lVar20;
                lVar20 = lVar20 + 1;
                iVar13 = (int)lVar20;
              } while (iVar13 < *(int *)(&this->field_0xd4 + (long)pp_Var6[-3]));
              iVar27 = iVar27 + iVar13;
              iVar26 = iVar26 + iVar13;
            }
            iVar26 = iVar26 + (iVar9 - iVar29);
            iVar24 = iVar24 + 1;
            p_Var18 = pp_Var6[-3];
            iVar13 = *(int *)(&this->field_0xd8 + (long)p_Var18);
          } while (iVar24 < iVar13);
        }
        pOVar19 = (Option *)((long)&this->_vptr_Pooling_x86_avx2 + (long)p_Var18);
        iVar29 = (int)uVar11;
        if (*(int *)&pOVar19[3].workspace_allocator == 0) {
          iVar9 = *(int *)((long)&pOVar19[3].workspace_allocator + 4);
          if ((((iVar13 == 2) && (iVar9 == 2)) &&
              (iVar21._0_1_ = pOVar19[3].use_winograd_convolution,
              iVar21._1_1_ = pOVar19[3].use_sgemm_convolution,
              iVar21._2_1_ = pOVar19[3].use_int8_inference,
              iVar21._3_1_ = pOVar19[3].use_vulkan_compute, iVar21 == 2)) &&
             (iVar24._0_1_ = pOVar19[3].use_bf16_storage, iVar24._1_1_ = pOVar19[3].use_fp16_packed,
             iVar24._2_1_ = pOVar19[3].use_fp16_storage,
             iVar24._3_1_ = pOVar19[3].use_fp16_arithmetic, iVar24 == 2)) {
            pooling2x2s2_max_pack4_sse(&local_e8,local_120,pOVar19);
          }
          else if (((iVar13 == 3) && (iVar9 == 3)) &&
                  ((iVar9._0_1_ = pOVar19[3].use_winograd_convolution,
                   iVar9._1_1_ = pOVar19[3].use_sgemm_convolution,
                   iVar9._2_1_ = pOVar19[3].use_int8_inference,
                   iVar9._3_1_ = pOVar19[3].use_vulkan_compute, iVar9 == 2 &&
                   (iVar13._0_1_ = pOVar19[3].use_bf16_storage,
                   iVar13._1_1_ = pOVar19[3].use_fp16_packed,
                   iVar13._2_1_ = pOVar19[3].use_fp16_storage,
                   iVar13._3_1_ = pOVar19[3].use_fp16_arithmetic, iVar13 == 2)))) {
            pooling3x3s2_max_pack4_sse(&local_e8,local_120,pOVar19);
          }
          else if (0 < (int)uVar10) {
            local_138 = 0;
            do {
              if (-1 < (int)local_118) {
                pvVar28 = (void *)(local_120->cstep * local_138 * local_120->elemsize +
                                  (long)local_120->data);
                pp_Var6 = this->_vptr_Pooling_x86_avx2;
                iVar9 = 0;
                do {
                  if (-1 < (int)local_f8) {
                    uVar32 = 0;
                    do {
                      lVar20 = (long)*(int *)(&this->field_0xe0 + (long)pp_Var6[-3]) * (long)iVar9 *
                               (long)local_e8.w *
                               CONCAT44(local_e8.elemsize._4_4_,(int)local_e8.elemsize) +
                               local_e8.cstep * local_138 *
                               CONCAT44(local_e8.elemsize._4_4_,(int)local_e8.elemsize);
                      lVar23 = (long)(*(int *)(&this->field_0xdc + (long)pp_Var6[-3]) * (int)uVar32
                                     * 4);
                      auVar38 = *(undefined1 (*) [16])((long)local_e8.data + lVar23 * 4 + lVar20);
                      if (0 < iVar29) {
                        uVar22 = 0;
                        do {
                          auVar38 = vmaxps_avx(auVar38,*(undefined1 (*) [16])
                                                        ((long)local_e8.data +
                                                        (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar22] *
                                                  0x10 + lVar23 * 4 + lVar20));
                          uVar22 = uVar22 + 1;
                        } while ((uVar11 & 0xffffffff) != uVar22);
                      }
                      *(undefined1 (*) [16])((long)pvVar28 + uVar32 * 0x10) = auVar38;
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != uVar31);
                  }
                  pvVar28 = (void *)((long)pvVar28 + (long)(int)(uVar31 * 4) * 4);
                  bVar33 = iVar9 != (int)local_118;
                  iVar9 = iVar9 + 1;
                } while (bVar33);
              }
              local_138 = local_138 + 1;
            } while (local_138 != uVar17);
          }
        }
        else if (*(int *)&pOVar19[3].workspace_allocator == 1) {
          iVar26._0_1_ = pOVar19[3].use_reserved_8;
          iVar26._1_1_ = pOVar19[3].use_reserved_9;
          iVar26._2_1_ = pOVar19[3].use_reserved_10;
          iVar26._3_1_ = pOVar19[3].use_reserved_11;
          if (iVar26 == 0) {
            iVar13 = 0;
            iVar29._0_1_ = pOVar19[3].use_reserved_4;
            iVar29._1_1_ = pOVar19[3].use_reserved_5;
            iVar29._2_1_ = pOVar19[3].use_reserved_6;
            iVar29._3_1_ = pOVar19[3].use_reserved_7;
            iVar24 = 0;
            if (iVar29 == 0) {
              iVar13 = (bottom_blob->w - local_e8.w) + *(int *)&pOVar19[3].use_int8_packed +
                       *(int *)&pOVar19[3].use_shader_pack8;
              iVar24 = (bottom_blob->h - local_e8.h) + *(int *)&pOVar19[3].use_subgroup_shuffle +
                       pOVar19[3].flush_denormals;
            }
            if (0 < (int)uVar10) {
              local_10c = iVar24 + iVar21;
              local_68 = (long)(int)(uVar31 * 4);
              local_98 = this->_vptr_Pooling_x86_avx2;
              local_58 = (ulong)uVar31;
              local_108 = 0;
              do {
                if (-1 < (int)local_118) {
                  local_70 = local_e8.data;
                  local_78 = CONCAT44(local_e8.elemsize._4_4_,(int)local_e8.elemsize);
                  local_f0 = (void *)(local_120->cstep * local_108 * local_120->elemsize +
                                     (long)local_120->data);
                  local_80 = (long)local_e8.w;
                  local_90 = local_78 * local_80;
                  local_88 = local_e8.cstep * local_108;
                  local_100 = 0;
                  do {
                    if (-1 < (int)local_f8) {
                      lVar20 = (long)(*(int *)(&this->field_0xe0 + (long)local_98[-3]) *
                                     (int)local_100);
                      local_60 = (void *)((local_80 * lVar20 + local_88) * local_78 +
                                         (long)local_e8.data);
                      uVar11 = 0;
                      do {
                        p_Var18 = local_98[-3];
                        if ((long)*(int *)(&this->field_0xd8 + (long)p_Var18) < 1) {
                          fVar44 = 0.0;
                          fVar34 = 0.0;
                          fVar36 = 0.0;
                          fVar42 = 0.0;
                          fVar43 = 0.0;
                        }
                        else {
                          lVar23 = (long)(*(int *)(&this->field_0xdc + (long)p_Var18) * (int)uVar11)
                          ;
                          pvVar28 = (void *)(lVar23 * 0x10 + (long)local_60);
                          fVar34 = 0.0;
                          fVar36 = 0.0;
                          fVar42 = 0.0;
                          fVar43 = 0.0;
                          lVar25 = 0;
                          iVar21 = 0;
                          do {
                            lVar12 = lVar25 + lVar20;
                            iVar29 = 100;
                            if ((*(int *)(&this->field_0xec + (long)p_Var18) <= lVar12) &&
                               (iVar29 = 0x62,
                               lVar12 < local_10c - *(int *)(&this->field_0xf0 + (long)p_Var18))) {
                              iVar29 = 0;
                              if (0 < (long)*(int *)(&this->field_0xd4 + (long)p_Var18)) {
                                lVar30 = 0;
                                lVar12 = lVar23;
                                do {
                                  iVar24 = 0x67;
                                  if ((*(int *)(&this->field_0xe4 + (long)p_Var18) <= lVar12) &&
                                     (iVar24 = 0x65,
                                     lVar12 < (iVar13 + iVar9) -
                                              *(int *)(&this->field_0xe8 + (long)p_Var18))) {
                                    pfVar14 = (float *)((long)pvVar28 + lVar30);
                                    fVar34 = fVar34 + *pfVar14;
                                    fVar36 = fVar36 + pfVar14[1];
                                    fVar42 = fVar42 + pfVar14[2];
                                    fVar43 = fVar43 + pfVar14[3];
                                    iVar21 = iVar21 + 1;
                                    iVar24 = 0;
                                  }
                                  if ((iVar24 != 0x67) && (iVar24 != 0)) break;
                                  lVar30 = lVar30 + 0x10;
                                  lVar12 = lVar12 + 1;
                                } while ((long)*(int *)(&this->field_0xd4 + (long)p_Var18) * 0x10 !=
                                         lVar30);
                              }
                            }
                            if ((iVar29 != 100) && (iVar29 != 0)) break;
                            lVar25 = lVar25 + 1;
                            pvVar28 = (void *)((long)pvVar28 + local_90);
                          } while (lVar25 != *(int *)(&this->field_0xd8 + (long)p_Var18));
                          fVar44 = (float)iVar21;
                          local_50 = uVar11;
                        }
                        fVar44 = 1.0 / fVar44;
                        auVar38._0_4_ = fVar44 * fVar34;
                        auVar38._4_4_ = fVar44 * fVar36;
                        auVar38._8_4_ = fVar44 * fVar42;
                        auVar38._12_4_ = fVar44 * fVar43;
                        *(undefined1 (*) [16])((long)local_f0 + uVar11 * 0x10) = auVar38;
                        uVar11 = uVar11 + 1;
                      } while (uVar11 != local_58);
                    }
                    local_f0 = (void *)((long)local_f0 + local_68 * 4);
                    uVar10 = (int)local_100 + 1;
                    bVar33 = (int)local_100 != (int)local_118;
                    local_100 = (ulong)uVar10;
                  } while (bVar33);
                }
                local_108 = local_108 + 1;
              } while (local_108 != uVar17);
            }
          }
          else if (0 < (int)uVar10) {
            fVar34 = 1.0 / (float)iVar29;
            local_138 = 0;
            do {
              if (-1 < (int)local_118) {
                pvVar28 = (void *)(local_120->cstep * local_138 * local_120->elemsize +
                                  (long)local_120->data);
                pp_Var6 = this->_vptr_Pooling_x86_avx2;
                iVar9 = 0;
                do {
                  if (-1 < (int)local_f8) {
                    uVar32 = 0;
                    do {
                      if (iVar29 < 1) {
                        fVar36 = 0.0;
                        fVar42 = 0.0;
                        fVar43 = 0.0;
                        fVar44 = 0.0;
                      }
                      else {
                        fVar36 = 0.0;
                        fVar42 = 0.0;
                        fVar43 = 0.0;
                        fVar44 = 0.0;
                        uVar22 = 0;
                        do {
                          pfVar14 = (float *)((long)local_e8.data +
                                             (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar22] *
                                             0x10 + (long)(*(int *)(&this->field_0xdc +
                                                                   (long)pp_Var6[-3]) * (int)uVar32
                                                          * 4) * 4 +
                                                    (long)*(int *)(&this->field_0xe0 +
                                                                  (long)pp_Var6[-3]) * (long)iVar9 *
                                                    (long)local_e8.w *
                                                    CONCAT44(local_e8.elemsize._4_4_,
                                                             (int)local_e8.elemsize) +
                                                    local_e8.cstep * local_138 *
                                                    CONCAT44(local_e8.elemsize._4_4_,
                                                             (int)local_e8.elemsize));
                          fVar36 = fVar36 + *pfVar14;
                          fVar42 = fVar42 + pfVar14[1];
                          fVar43 = fVar43 + pfVar14[2];
                          fVar44 = fVar44 + pfVar14[3];
                          uVar22 = uVar22 + 1;
                        } while ((uVar11 & 0xffffffff) != uVar22);
                      }
                      auVar37._0_4_ = fVar36 * fVar34;
                      auVar37._4_4_ = fVar42 * fVar34;
                      auVar37._8_4_ = fVar43 * fVar34;
                      auVar37._12_4_ = fVar44 * fVar34;
                      *(undefined1 (*) [16])((long)pvVar28 + uVar32 * 0x10) = auVar37;
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != uVar31);
                  }
                  pvVar28 = (void *)((long)pvVar28 + (long)(int)(uVar31 * 4) * 4);
                  bVar33 = iVar9 != (int)local_118;
                  iVar9 = iVar9 + 1;
                } while (bVar33);
              }
              local_138 = local_138 + 1;
            } while (local_138 != uVar17);
          }
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar13 = 0;
      }
    }
    piVar7 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    if (piVar7 == (int *)0x0) {
      return iVar13;
    }
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 != 0) {
      return iVar13;
    }
    if (local_e8.allocator != (Allocator *)0x0) {
      (*(local_e8.allocator)->_vptr_Allocator[3])();
      return iVar13;
    }
  }
  else {
    if (bottom_blob->elempack != 8) {
      if ((((this_00->kernel_w == this_00->kernel_h) && (this_00->stride_w == this_00->stride_h)) &&
          (this_00->stride_w == 2)) &&
         (((this_00->pooling_type == 0 && (this_00->global_pooling != 1)) &&
          (this_00->kernel_w == 2)))) {
        local_e8.cstep = 0;
        local_e8.data = (void *)0x0;
        local_e8.refcount._0_4_ = 0;
        local_e8.refcount._4_4_ = 0;
        local_e8.elemsize._0_4_ = 0;
        local_e8.elemsize._4_4_ = 0;
        local_e8.elempack = 0;
        local_e8.allocator = (Allocator *)0x0;
        local_e8.dims = 0;
        local_e8.w = 0;
        local_e8.h = 0;
        local_e8.d = 0;
        local_e8.c = 0;
        Pooling::make_padding
                  ((Pooling *)((long)&this->_vptr_Pooling_x86_avx2 + (long)pp_Var6[-3]),bottom_blob,
                   &local_e8,opt);
        iVar9 = -100;
        if ((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
          p_Var18 = this->_vptr_Pooling_x86_avx2[-3];
          Mat::create(top_blob,(local_e8.w - *(int *)(&this->field_0xd4 + (long)p_Var18)) /
                               *(int *)(&this->field_0xdc + (long)p_Var18) + 1,
                      (local_e8.h - *(int *)(&this->field_0xd8 + (long)p_Var18)) /
                      *(int *)(&this->field_0xe0 + (long)p_Var18) + 1,uVar10,_elemsize,
                      opt->blob_allocator);
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            pooling2x2s2_max_avx(&local_e8,top_blob,opt_00);
            iVar9 = 0;
          }
        }
        Mat::~Mat(&local_e8);
        return iVar9;
      }
      goto LAB_001fb6ff;
    }
    if (this_00->global_pooling != 0) {
      Mat::create(top_blob,uVar10,_elemsize,8,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar21 = iVar21 * iVar9;
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx2[-3]) == 0) {
        if ((int)uVar10 < 1) {
          return 0;
        }
        uVar11 = 0;
        do {
          lVar20 = bottom_blob->cstep * uVar11 * bottom_blob->elemsize;
          auVar35 = *(undefined1 (*) [32])((long)bottom_blob->data + lVar20);
          if (0 < iVar21) {
            pauVar15 = (undefined1 (*) [32])((long)bottom_blob->data + lVar20);
            iVar9 = iVar21;
            do {
              auVar35 = vmaxps_avx(auVar35,*pauVar15);
              pauVar15 = pauVar15 + 1;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar11 * 0x20) = auVar35;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar17);
        return 0;
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx2[-3]) != 1) {
        return 0;
      }
      if ((int)uVar10 < 1) {
        return 0;
      }
      fVar34 = 1.0 / (float)iVar21;
      uVar11 = 0;
      do {
        if (iVar21 < 1) {
          fVar36 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
          fVar44 = 0.0;
          fVar45 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
          fVar48 = 0.0;
        }
        else {
          pfVar14 = (float *)(bottom_blob->cstep * uVar11 * bottom_blob->elemsize +
                             (long)bottom_blob->data);
          fVar36 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
          fVar44 = 0.0;
          fVar45 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
          fVar48 = 0.0;
          iVar9 = iVar21;
          do {
            fVar36 = fVar36 + *pfVar14;
            fVar42 = fVar42 + pfVar14[1];
            fVar43 = fVar43 + pfVar14[2];
            fVar44 = fVar44 + pfVar14[3];
            fVar45 = fVar45 + pfVar14[4];
            fVar46 = fVar46 + pfVar14[5];
            fVar47 = fVar47 + pfVar14[6];
            fVar48 = fVar48 + pfVar14[7];
            pfVar14 = pfVar14 + 8;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        pfVar14 = (float *)((long)top_blob->data + uVar11 * 0x20);
        *pfVar14 = fVar36 * fVar34;
        pfVar14[1] = fVar42 * fVar34;
        pfVar14[2] = fVar43 * fVar34;
        pfVar14[3] = fVar44 * fVar34;
        pfVar14[4] = fVar45 * fVar34;
        pfVar14[5] = fVar46 * fVar34;
        pfVar14[6] = fVar47 * fVar34;
        pfVar14[7] = fVar48;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar17);
      return 0;
    }
    local_e8.cstep = 0;
    local_e8.data = (void *)0x0;
    local_e8.refcount._0_4_ = 0;
    local_e8.refcount._4_4_ = 0;
    local_e8.elemsize._0_4_ = 0;
    local_e8.elemsize._4_4_ = 0;
    local_e8.elempack = 0;
    local_e8.allocator = (Allocator *)0x0;
    local_e8.dims = 0;
    local_e8.d = 0;
    local_e8.c = 0;
    local_e8.w = local_e8.refcount._4_4_;
    local_e8.h = (int)local_e8.elemsize;
    Pooling::make_padding
              ((Pooling *)((long)&this->_vptr_Pooling_x86_avx2 + (long)pp_Var6[-3]),bottom_blob,
               &local_e8,opt);
    iVar21 = local_e8.h;
    iVar9 = local_e8.w;
    pMVar8 = local_120;
    iVar13 = -100;
    if ((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
      p_Var18 = this->_vptr_Pooling_x86_avx2[-3];
      uVar11 = (long)(local_e8.w - *(int *)(&this->field_0xd4 + (long)p_Var18)) /
               (long)*(int *)(&this->field_0xdc + (long)p_Var18);
      local_f8 = uVar11 & 0xffffffff;
      uVar32 = (long)(local_e8.h - *(int *)(&this->field_0xd8 + (long)p_Var18)) /
               (long)*(int *)(&this->field_0xe0 + (long)p_Var18);
      local_118 = uVar32 & 0xffffffff;
      uVar31 = (int)uVar11 + 1;
      Mat::create(local_120,uVar31,(int)uVar32 + 1,uVar10,_elemsize,8,opt->blob_allocator);
      if ((pMVar8->data != (void *)0x0) && ((long)pMVar8->c * pMVar8->cstep != 0)) {
        uVar11 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86_avx2[-3]) *
                 (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86_avx2[-3]);
        std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar11,&local_121);
        pp_Var6 = this->_vptr_Pooling_x86_avx2;
        p_Var18 = pp_Var6[-3];
        iVar13 = *(int *)(&this->field_0xd8 + (long)p_Var18);
        if (0 < iVar13) {
          iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var18);
          iVar24 = 0;
          iVar26 = 0;
          iVar27 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var6[-3])) {
              lVar20 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar24 + lVar20] = iVar26 + (int)lVar20;
                lVar20 = lVar20 + 1;
                iVar13 = (int)lVar20;
              } while (iVar13 < *(int *)(&this->field_0xd4 + (long)pp_Var6[-3]));
              iVar24 = iVar24 + iVar13;
              iVar26 = iVar26 + iVar13;
            }
            iVar26 = iVar26 + (iVar9 - iVar29);
            iVar27 = iVar27 + 1;
            p_Var18 = pp_Var6[-3];
            iVar13 = *(int *)(&this->field_0xd8 + (long)p_Var18);
          } while (iVar27 < iVar13);
        }
        pOVar19 = (Option *)((long)&this->_vptr_Pooling_x86_avx2 + (long)p_Var18);
        iVar29 = (int)uVar11;
        if (*(int *)&pOVar19[3].workspace_allocator == 0) {
          iVar9 = *(int *)((long)&pOVar19[3].workspace_allocator + 4);
          if ((((iVar13 == 2) && (iVar9 == 2)) &&
              (iVar27._0_1_ = pOVar19[3].use_winograd_convolution,
              iVar27._1_1_ = pOVar19[3].use_sgemm_convolution,
              iVar27._2_1_ = pOVar19[3].use_int8_inference,
              iVar27._3_1_ = pOVar19[3].use_vulkan_compute, iVar27 == 2)) &&
             (iVar2._0_1_ = pOVar19[3].use_bf16_storage, iVar2._1_1_ = pOVar19[3].use_fp16_packed,
             iVar2._2_1_ = pOVar19[3].use_fp16_storage, iVar2._3_1_ = pOVar19[3].use_fp16_arithmetic
             , iVar2 == 2)) {
            pooling2x2s2_max_pack8_avx(&local_e8,local_120,pOVar19);
          }
          else if (((iVar13 == 3) && (iVar9 == 3)) &&
                  ((iVar3._0_1_ = pOVar19[3].use_winograd_convolution,
                   iVar3._1_1_ = pOVar19[3].use_sgemm_convolution,
                   iVar3._2_1_ = pOVar19[3].use_int8_inference,
                   iVar3._3_1_ = pOVar19[3].use_vulkan_compute, iVar3 == 2 &&
                   (iVar4._0_1_ = pOVar19[3].use_bf16_storage,
                   iVar4._1_1_ = pOVar19[3].use_fp16_packed,
                   iVar4._2_1_ = pOVar19[3].use_fp16_storage,
                   iVar4._3_1_ = pOVar19[3].use_fp16_arithmetic, iVar4 == 2)))) {
            pooling3x3s2_max_pack8_avx(&local_e8,local_120,pOVar19);
          }
          else if (0 < (int)uVar10) {
            local_138 = 0;
            do {
              if (-1 < (int)local_118) {
                pvVar28 = (void *)(local_120->cstep * local_138 * local_120->elemsize +
                                  (long)local_120->data);
                pp_Var6 = this->_vptr_Pooling_x86_avx2;
                iVar9 = 0;
                do {
                  if (-1 < (int)local_f8) {
                    uVar32 = 0;
                    do {
                      lVar20 = (long)*(int *)(&this->field_0xe0 + (long)pp_Var6[-3]) * (long)iVar9 *
                               (long)local_e8.w *
                               CONCAT44(local_e8.elemsize._4_4_,(int)local_e8.elemsize) +
                               local_e8.cstep * local_138 *
                               CONCAT44(local_e8.elemsize._4_4_,(int)local_e8.elemsize);
                      lVar23 = (long)(*(int *)(&this->field_0xdc + (long)pp_Var6[-3]) * (int)uVar32
                                     * 8);
                      auVar35 = *(undefined1 (*) [32])((long)local_e8.data + lVar23 * 4 + lVar20);
                      if (0 < iVar29) {
                        uVar22 = 0;
                        do {
                          auVar35 = vmaxps_avx(auVar35,*(undefined1 (*) [32])
                                                        ((long)local_e8.data +
                                                        (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar22] *
                                                  0x20 + lVar23 * 4 + lVar20));
                          uVar22 = uVar22 + 1;
                        } while ((uVar11 & 0xffffffff) != uVar22);
                      }
                      *(undefined1 (*) [32])((long)pvVar28 + uVar32 * 0x20) = auVar35;
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != uVar31);
                  }
                  pvVar28 = (void *)((long)pvVar28 + (long)(int)(uVar31 * 8) * 4);
                  bVar33 = iVar9 != (int)local_118;
                  iVar9 = iVar9 + 1;
                } while (bVar33);
              }
              local_138 = local_138 + 1;
            } while (local_138 != uVar17);
          }
        }
        else if (*(int *)&pOVar19[3].workspace_allocator == 1) {
          iVar1._0_1_ = pOVar19[3].use_reserved_8;
          iVar1._1_1_ = pOVar19[3].use_reserved_9;
          iVar1._2_1_ = pOVar19[3].use_reserved_10;
          iVar1._3_1_ = pOVar19[3].use_reserved_11;
          if (iVar1 == 0) {
            iVar29 = 0;
            iVar5._0_1_ = pOVar19[3].use_reserved_4;
            iVar5._1_1_ = pOVar19[3].use_reserved_5;
            iVar5._2_1_ = pOVar19[3].use_reserved_6;
            iVar5._3_1_ = pOVar19[3].use_reserved_7;
            iVar13 = 0;
            if (iVar5 == 0) {
              iVar13 = (bottom_blob->w - local_e8.w) + *(int *)&pOVar19[3].use_int8_packed +
                       *(int *)&pOVar19[3].use_shader_pack8;
              iVar29 = (bottom_blob->h - local_e8.h) + *(int *)&pOVar19[3].use_subgroup_shuffle +
                       pOVar19[3].flush_denormals;
            }
            if (0 < (int)uVar10) {
              local_10c = iVar29 + iVar21;
              local_68 = (long)(int)(uVar31 * 8);
              local_98 = this->_vptr_Pooling_x86_avx2;
              local_58 = (ulong)uVar31;
              local_108 = 0;
              do {
                if (-1 < (int)local_118) {
                  local_70 = local_e8.data;
                  local_78 = CONCAT44(local_e8.elemsize._4_4_,(int)local_e8.elemsize);
                  local_f0 = (void *)(local_120->cstep * local_108 * local_120->elemsize +
                                     (long)local_120->data);
                  local_80 = (long)local_e8.w;
                  local_90 = local_78 * local_80;
                  local_88 = local_e8.cstep * local_108;
                  local_100 = 0;
                  do {
                    if (-1 < (int)local_f8) {
                      lVar20 = (long)(*(int *)(&this->field_0xe0 + (long)local_98[-3]) *
                                     (int)local_100);
                      local_60 = (void *)((local_80 * lVar20 + local_88) * local_78 +
                                         (long)local_e8.data);
                      uVar11 = 0;
                      do {
                        p_Var18 = local_98[-3];
                        if ((long)*(int *)(&this->field_0xd8 + (long)p_Var18) < 1) {
                          auVar39 = ZEXT864(0);
                          fVar34 = 0.0;
                        }
                        else {
                          lVar23 = (long)(*(int *)(&this->field_0xdc + (long)p_Var18) * (int)uVar11)
                          ;
                          pvVar28 = (void *)(lVar23 * 0x20 + (long)local_60);
                          lVar25 = 0;
                          auVar39 = ZEXT864(0);
                          iVar21 = 0;
                          do {
                            lVar12 = lVar25 + lVar20;
                            iVar29 = 0x2b;
                            if ((*(int *)(&this->field_0xec + (long)p_Var18) <= lVar12) &&
                               (iVar29 = 0x29,
                               lVar12 < local_10c - *(int *)(&this->field_0xf0 + (long)p_Var18))) {
                              iVar29 = 0;
                              if (0 < (long)*(int *)(&this->field_0xd4 + (long)p_Var18)) {
                                lVar30 = 0;
                                lVar12 = lVar23;
                                do {
                                  iVar24 = 0x2e;
                                  if ((*(int *)(&this->field_0xe4 + (long)p_Var18) <= lVar12) &&
                                     (iVar24 = 0x2c,
                                     lVar12 < (iVar13 + iVar9) -
                                              *(int *)(&this->field_0xe8 + (long)p_Var18))) {
                                    pfVar14 = (float *)((long)pvVar28 + lVar30);
                                    auVar39 = ZEXT3264(CONCAT428(auVar39._28_4_ + pfVar14[7],
                                                                 CONCAT424(auVar39._24_4_ +
                                                                           pfVar14[6],
                                                                           CONCAT420(auVar39._20_4_
                                                                                     + pfVar14[5],
                                                                                     CONCAT416(
                                                  auVar39._16_4_ + pfVar14[4],
                                                  CONCAT412(auVar39._12_4_ + pfVar14[3],
                                                            CONCAT48(auVar39._8_4_ + pfVar14[2],
                                                                     CONCAT44(auVar39._4_4_ +
                                                                              pfVar14[1],
                                                                              auVar39._0_4_ +
                                                                              *pfVar14))))))));
                                    iVar21 = iVar21 + 1;
                                    iVar24 = 0;
                                  }
                                  if ((iVar24 != 0x2e) && (iVar24 != 0)) break;
                                  lVar30 = lVar30 + 0x20;
                                  lVar12 = lVar12 + 1;
                                } while ((long)*(int *)(&this->field_0xd4 + (long)p_Var18) * 0x20 !=
                                         lVar30);
                              }
                            }
                            if ((iVar29 != 0x2b) && (iVar29 != 0)) break;
                            lVar25 = lVar25 + 1;
                            pvVar28 = (void *)((long)pvVar28 + local_90);
                          } while (lVar25 != *(int *)(&this->field_0xd8 + (long)p_Var18));
                          fVar34 = (float)iVar21;
                          local_50 = uVar11;
                        }
                        fVar34 = 1.0 / fVar34;
                        auVar41._0_4_ = fVar34 * auVar39._0_4_;
                        auVar41._4_4_ = fVar34 * auVar39._4_4_;
                        auVar41._8_4_ = fVar34 * auVar39._8_4_;
                        auVar41._12_4_ = fVar34 * auVar39._12_4_;
                        auVar41._16_4_ = fVar34 * auVar39._16_4_;
                        auVar41._20_4_ = fVar34 * auVar39._20_4_;
                        auVar41._28_36_ = auVar39._28_36_;
                        auVar41._24_4_ = fVar34 * auVar39._24_4_;
                        *(undefined1 (*) [32])((long)local_f0 + uVar11 * 0x20) = auVar41._0_32_;
                        uVar11 = uVar11 + 1;
                      } while (uVar11 != local_58);
                    }
                    local_f0 = (void *)((long)local_f0 + local_68 * 4);
                    uVar10 = (int)local_100 + 1;
                    bVar33 = (int)local_100 != (int)local_118;
                    local_100 = (ulong)uVar10;
                  } while (bVar33);
                }
                local_108 = local_108 + 1;
              } while (local_108 != uVar17);
            }
          }
          else if (0 < (int)uVar10) {
            fVar34 = 1.0 / (float)iVar29;
            local_138 = 0;
            do {
              if (-1 < (int)local_118) {
                pvVar28 = (void *)(local_120->cstep * local_138 * local_120->elemsize +
                                  (long)local_120->data);
                pp_Var6 = this->_vptr_Pooling_x86_avx2;
                iVar9 = 0;
                do {
                  if (-1 < (int)local_f8) {
                    uVar32 = 0;
                    do {
                      if (iVar29 < 1) {
                        auVar39 = ZEXT864(0);
                      }
                      else {
                        auVar39 = ZEXT864(0);
                        uVar22 = 0;
                        do {
                          pfVar14 = (float *)((long)local_e8.data +
                                             (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar22] *
                                             0x20 + (long)(*(int *)(&this->field_0xdc +
                                                                   (long)pp_Var6[-3]) * (int)uVar32
                                                          * 8) * 4 +
                                                    (long)*(int *)(&this->field_0xe0 +
                                                                  (long)pp_Var6[-3]) * (long)iVar9 *
                                                    (long)local_e8.w *
                                                    CONCAT44(local_e8.elemsize._4_4_,
                                                             (int)local_e8.elemsize) +
                                                    local_e8.cstep * local_138 *
                                                    CONCAT44(local_e8.elemsize._4_4_,
                                                             (int)local_e8.elemsize));
                          auVar39 = ZEXT3264(CONCAT428(auVar39._28_4_ + pfVar14[7],
                                                       CONCAT424(auVar39._24_4_ + pfVar14[6],
                                                                 CONCAT420(auVar39._20_4_ +
                                                                           pfVar14[5],
                                                                           CONCAT416(auVar39._16_4_
                                                                                     + pfVar14[4],
                                                                                     CONCAT412(
                                                  auVar39._12_4_ + pfVar14[3],
                                                  CONCAT48(auVar39._8_4_ + pfVar14[2],
                                                           CONCAT44(auVar39._4_4_ + pfVar14[1],
                                                                    auVar39._0_4_ + *pfVar14))))))))
                          ;
                          uVar22 = uVar22 + 1;
                        } while ((uVar11 & 0xffffffff) != uVar22);
                      }
                      auVar40._0_4_ = auVar39._0_4_ * fVar34;
                      auVar40._4_4_ = auVar39._4_4_ * fVar34;
                      auVar40._8_4_ = auVar39._8_4_ * fVar34;
                      auVar40._12_4_ = auVar39._12_4_ * fVar34;
                      auVar40._16_4_ = auVar39._16_4_ * fVar34;
                      auVar40._20_4_ = auVar39._20_4_ * fVar34;
                      auVar40._28_36_ = auVar39._28_36_;
                      auVar40._24_4_ = auVar39._24_4_ * fVar34;
                      *(undefined1 (*) [32])((long)pvVar28 + uVar32 * 0x20) = auVar40._0_32_;
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != uVar31);
                  }
                  pvVar28 = (void *)((long)pvVar28 + (long)(int)(uVar31 * 8) * 4);
                  bVar33 = iVar9 != (int)local_118;
                  iVar9 = iVar9 + 1;
                } while (bVar33);
              }
              local_138 = local_138 + 1;
            } while (local_138 != uVar17);
          }
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar13 = 0;
      }
    }
    piVar7 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    if (piVar7 == (int *)0x0) {
      return iVar13;
    }
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 != 0) {
      return iVar13;
    }
    if (local_e8.allocator != (Allocator *)0x0) {
      (*(local_e8.allocator)->_vptr_Allocator[3])();
      return iVar13;
    }
  }
  if (local_e8.data != (void *)0x0) {
    free(local_e8.data);
  }
  return iVar13;
}

Assistant:

int Pooling_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}